

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O1

int flv_read_header(FILE *flv,int *has_audio,int *has_video)

{
  int iVar1;
  size_t sVar2;
  uint8_t h [13];
  char local_1d;
  char local_1c;
  char local_1b;
  byte local_19;
  
  sVar2 = fread(&local_1d,1,0xd,(FILE *)flv);
  iVar1 = 0;
  if ((((sVar2 == 0xd) && (iVar1 = 0, local_1d == 'F')) && (iVar1 = 0, local_1c == 'L')) &&
     (local_1b == 'V')) {
    *has_audio = local_19 & 4;
    *has_video = local_19 & 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int flv_read_header(FILE* flv, int* has_audio, int* has_video)
{
    uint8_t h[FLV_HEADER_SIZE];

    if (FLV_HEADER_SIZE != fread(&h[0], 1, FLV_HEADER_SIZE, flv)) {
        return 0;
    }

    if ('F' != h[0] || 'L' != h[1] || 'V' != h[2]) {
        return 0;
    }

    (*has_audio) = h[4] & 0x04;
    (*has_video) = h[4] & 0x01;
    return 1;
}